

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_null(mg_session *session)

{
  mg_session *in_RDI;
  int status;
  uint8_t marker;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int local_4;
  
  local_4 = mg_session_read_uint8
                      ((mg_session *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                       (uint8_t *)0x107f48);
  if (local_4 == 0) {
    if ((char)((uint)in_stack_ffffffffffffffec >> 0x18) == -0x40) {
      local_4 = 0;
    }
    else {
      mg_session_set_error(in_RDI,"wrong value marker");
      local_4 = -6;
    }
  }
  return local_4;
}

Assistant:

int mg_session_read_null(mg_session *session) {
  uint8_t marker;
  MG_RETURN_IF_FAILED(mg_session_read_uint8(session, &marker));
  if (marker != MG_MARKER_NULL) {
    mg_session_set_error(session, "wrong value marker");
    return MG_ERROR_DECODING_FAILED;
  }
  return 0;
}